

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledRgbaOutputFile::writeTiles
          (TiledRgbaOutputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  int dx;
  int dx_00;
  int dy;
  lock_guard<std::mutex> lock;
  
  __mutex = (pthread_mutex_t *)this->_toYa;
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    for (; dx_00 = dxMin, dyMin <= dyMax; dyMin = dyMin + 1) {
      for (; dx_00 <= dxMax; dx_00 = dx_00 + 1) {
        ToYa::writeTile(this->_toYa,dx_00,dyMin,lx,ly);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  TiledOutputFile::writeTiles(this->_outputFile,dxMin,dxMax,dyMin,dyMax,lx,ly);
  return;
}

Assistant:

void
TiledRgbaOutputFile::writeTiles (
    int dxMin, int dxMax, int dyMin, int dyMax, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
                _toYa->writeTile (dx, dy, lx, ly);
    }
    else { _outputFile->writeTiles (dxMin, dxMax, dyMin, dyMax, lx, ly); }
}